

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

fdb_status compactor_register_file_removing(filemgr *file,err_log_callback *log_callback)

{
  avl_node *paVar1;
  char *__dest;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  openfiles_elem_conflict *elem;
  openfiles_elem_conflict query;
  avl_node *a;
  fdb_status fs;
  char local_560 [8];
  avl_cmp_func *in_stack_fffffffffffffaa8;
  avl_node *in_stack_fffffffffffffab0;
  avl_tree *in_stack_fffffffffffffab8;
  avl_node *in_stack_fffffffffffffac0;
  avl_tree *in_stack_fffffffffffffac8;
  
  strcpy(local_560,(char *)*in_RDI);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8)
  ;
  if (paVar1 == (avl_node *)0x0) {
    __dest = (char *)calloc(1,0x540);
    strcpy(__dest,(char *)*in_RDI);
    *(byte *)((long)in_RDI + 0xc) = *(byte *)((long)in_RDI + 0xc) | 0x10;
    *(undefined8 **)(__dest + 0x400) = in_RDI;
    __dest[0x500] = '\x01';
    __dest[0x501] = '\0';
    __dest[0x502] = '\0';
    __dest[0x503] = '\0';
    __dest[0x504] = '\x01';
    __dest[0x505] = '\x01';
    __dest[0x506] = '\0';
    *(undefined8 *)(__dest + 0x508) = in_RSI;
    gettimeofday((timeval *)(__dest + 0x528),(__timezone_ptr_t)0x0);
    *(size_t *)(__dest + 0x538) = sleep_duration;
    avl_insert(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
               (avl_cmp_func *)in_stack_fffffffffffffab8);
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
    pthread_cond_signal((pthread_cond_t *)&sync_cond);
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status compactor_register_file_removing(struct filemgr *file,
                                            err_log_callback *log_callback)
{
    fdb_status fs = FDB_RESULT_SUCCESS;
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, file->filename);
    // first search the existing file
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a == NULL) {
        // doesn't exist
        // create a fake & temporary element for the file to be removed.
        elem = (struct openfiles_elem *)calloc(1, sizeof(struct openfiles_elem));
        strcpy(elem->filename, file->filename);

        // set flag
        file->fflags |= FILEMGR_REMOVAL_IN_PROG;

        elem->file = file;
        elem->register_count = 1;
        // to prevent this element to be compacted, set all flags
        elem->compaction_flag = true;
        elem->daemon_compact_in_progress = true;
        elem->removal_activated = false;
        elem->log_callback = log_callback;
        gettimeofday(&elem->last_compaction_timestamp, NULL);
        // Init the compaction interval using the global param
        elem->interval = sleep_duration;
        avl_insert(&openfiles, &elem->avl, _compactor_cmp);
        mutex_unlock(&cpt_lock); // Releasing the lock here should be OK as
                                 // subsequent registration attempts for the same file
                                 // will be simply processed by incrementing its
                                 // counter below.

        // wake up any sleeping thread
        mutex_lock(&sync_mutex);
        thread_cond_signal(&sync_cond);
        mutex_unlock(&sync_mutex);

    } else {
        // already exists .. just ignore
        mutex_unlock(&cpt_lock);
    }
    return fs;
}